

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension)

{
  Symbol symbol;
  __type _Var1;
  bool bVar2;
  FieldDescriptor FVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  int32 iVar6;
  int iVar7;
  Type TVar8;
  CppType CVar9;
  string *psVar10;
  long lVar11;
  int64 iVar12;
  char *pcVar13;
  uint64 uVar14;
  ulong uVar15;
  OneofDescriptor *pOVar16;
  FieldOptions *orig_options;
  FieldDescriptor *in_RCX;
  Descriptor *in_RDX;
  string *in_RSI;
  long in_RDI;
  byte in_R8B;
  float fVar17;
  double dVar18;
  char *end_pos;
  string lowercase_name;
  string *full_name;
  string *scope;
  SubstituteArg *in_stack_fffffffffffff558;
  SubstituteArg *in_stack_fffffffffffff560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff568;
  FieldDescriptor *in_stack_fffffffffffff570;
  string *in_stack_fffffffffffff578;
  Tables *in_stack_fffffffffffff580;
  string *in_stack_fffffffffffff588;
  undefined8 in_stack_fffffffffffff598;
  int options_field_tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5a0;
  SubstituteArg *in_stack_fffffffffffff5a8;
  undefined7 in_stack_fffffffffffff5b0;
  undefined1 in_stack_fffffffffffff5b7;
  SubstituteArg *in_stack_fffffffffffff5b8;
  SubstituteArg *in_stack_fffffffffffff5c0;
  undefined4 in_stack_fffffffffffff5c8;
  ErrorLocation in_stack_fffffffffffff5cc;
  Message *in_stack_fffffffffffff5d0;
  string *in_stack_fffffffffffff5d8;
  undefined4 in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e4;
  string *in_stack_fffffffffffff5e8;
  undefined4 in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f4;
  SubstituteArg *in_stack_fffffffffffff600;
  undefined7 in_stack_fffffffffffff608;
  undefined1 in_stack_fffffffffffff60f;
  SubstituteArg *in_stack_fffffffffffff610;
  undefined7 in_stack_fffffffffffff618;
  undefined1 in_stack_fffffffffffff61f;
  DescriptorBuilder *in_stack_fffffffffffff620;
  undefined7 in_stack_fffffffffffff628;
  undefined1 in_stack_fffffffffffff62f;
  string *in_stack_fffffffffffff630;
  undefined8 in_stack_fffffffffffff638;
  ErrorLocation location;
  int in_stack_fffffffffffff640;
  int in_stack_fffffffffffff644;
  string *in_stack_fffffffffffff648;
  DescriptorBuilder *in_stack_fffffffffffff650;
  string *in_stack_fffffffffffff7d8;
  undefined5 in_stack_fffffffffffff7e0;
  undefined1 in_stack_fffffffffffff7e5;
  string *in_stack_fffffffffffff7e8;
  string *in_stack_fffffffffffff7f0;
  DescriptorBuilder *in_stack_fffffffffffff7f8;
  string *in_stack_fffffffffffff810;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_fffffffffffff818;
  string *local_778;
  Symbol local_768;
  SubstituteArg local_758;
  SubstituteArg local_728;
  SubstituteArg local_6f8;
  SubstituteArg local_6c8;
  SubstituteArg local_698;
  SubstituteArg local_668;
  SubstituteArg local_638;
  SubstituteArg local_608 [3];
  string local_578 [32];
  SubstituteArg local_558;
  SubstituteArg local_528;
  SubstituteArg local_4f8;
  SubstituteArg local_4c8;
  SubstituteArg local_498;
  SubstituteArg local_468;
  SubstituteArg local_438;
  SubstituteArg local_408 [3];
  string local_378 [32];
  SubstituteArg local_358;
  SubstituteArg local_328;
  SubstituteArg local_2f8;
  SubstituteArg local_2c8;
  SubstituteArg local_298;
  SubstituteArg local_268;
  SubstituteArg local_238;
  SubstituteArg local_208;
  SubstituteArg local_1d8 [2];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  char *local_f8;
  string local_f0 [32];
  string local_d0 [32];
  FieldDescriptorProto_Label local_b0;
  FieldDescriptorProto_Type local_ac;
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  string *local_38;
  string *local_30;
  byte local_21;
  FieldDescriptor *local_20;
  Descriptor *local_18;
  string *local_10;
  
  location = (ErrorLocation)((ulong)in_stack_fffffffffffff638 >> 0x20);
  options_field_tag = (int)((ulong)in_stack_fffffffffffff598 >> 0x20);
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDX == (Descriptor *)0x0) {
    local_778 = FileDescriptor::package_abi_cxx11_(*(FileDescriptor **)(in_RDI + 0x58));
  }
  else {
    local_778 = Descriptor::full_name_abi_cxx11_(in_RDX);
  }
  local_30 = local_778;
  FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)0x4c16eb);
  local_38 = AllocateNameString(in_stack_fffffffffffff620,
                                (string *)
                                CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618),
                                (string *)in_stack_fffffffffffff610);
  FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)0x4c1718);
  ValidateSymbolName((DescriptorBuilder *)
                     CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                     in_stack_fffffffffffff5e8,
                     (string *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                     (Message *)in_stack_fffffffffffff5d8);
  FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)0x4c1759);
  psVar10 = DescriptorPool::Tables::AllocateString
                      (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  *(string **)local_20 = psVar10;
  *(string **)(local_20 + 8) = local_38;
  *(undefined8 *)(local_20 + 0x28) = *(undefined8 *)(in_RDI + 0x58);
  iVar6 = FieldDescriptorProto::number((FieldDescriptorProto *)0x4c17b0);
  *(int32 *)(local_20 + 0x44) = iVar6;
  local_20[0x42] = (FieldDescriptor)(local_21 & 1);
  psVar10 = FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)0x4c17df);
  std::__cxx11::string::string(local_58,(string *)psVar10);
  LowerString((string *)in_stack_fffffffffffff560);
  FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)0x4c1813);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  if (_Var1) {
    *(undefined8 *)(local_20 + 0x10) = *(undefined8 *)local_20;
  }
  else {
    psVar10 = DescriptorPool::Tables::AllocateString
                        (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    *(string **)(local_20 + 0x10) = psVar10;
  }
  FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)0x4c18c2);
  anon_unknown_1::ToCamelCase
            ((string *)in_stack_fffffffffffff5a8,SUB81((ulong)in_stack_fffffffffffff5a0 >> 0x38,0));
  psVar10 = DescriptorPool::Tables::AllocateString
                      (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  *(string **)(local_20 + 0x18) = psVar10;
  std::__cxx11::string::~string(local_88);
  bVar2 = FieldDescriptorProto::has_json_name((FieldDescriptorProto *)0x4c1935);
  if (bVar2) {
    local_20[0x41] = (FieldDescriptor)0x1;
    FieldDescriptorProto::json_name_abi_cxx11_((FieldDescriptorProto *)0x4c197b);
    psVar10 = DescriptorPool::Tables::AllocateString
                        (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    *(string **)(local_20 + 0x20) = psVar10;
  }
  else {
    local_20[0x41] = (FieldDescriptor)0x0;
    in_stack_fffffffffffff818 = *(anon_union_8_8_13f84498_for_Symbol_2 *)(in_RDI + 8);
    FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)0x4c1a10);
    anon_unknown_1::ToJsonName(in_stack_fffffffffffff588);
    in_stack_fffffffffffff810 =
         DescriptorPool::Tables::AllocateString(in_stack_fffffffffffff580,in_stack_fffffffffffff578)
    ;
    *(string **)(local_20 + 0x20) = in_stack_fffffffffffff810;
    std::__cxx11::string::~string(local_a8);
  }
  local_ac = FieldDescriptorProto::type((FieldDescriptorProto *)0x4c1aa6);
  iVar7 = internal::implicit_cast<int,google::protobuf::FieldDescriptorProto_Type>(&local_ac);
  *(int *)(local_20 + 0x38) = iVar7;
  local_b0 = FieldDescriptorProto::label((FieldDescriptorProto *)0x4c1af2);
  iVar7 = internal::implicit_cast<int,google::protobuf::FieldDescriptorProto_Label>(&local_b0);
  *(int *)(local_20 + 0x3c) = iVar7;
  if ((((byte)local_20[0x42] & 1) != 0) && (*(int *)(local_20 + 0x3c) == 2)) {
    in_stack_fffffffffffff7f8 = (DescriptorBuilder *)FieldDescriptor::full_name_abi_cxx11_(local_20)
    ;
    in_stack_fffffffffffff7e8 = local_10;
    in_stack_fffffffffffff7f0 = FieldDescriptor::full_name_abi_cxx11_(local_20);
    std::operator+((char *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    std::operator+(in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560);
    AddError(in_stack_fffffffffffff650,in_stack_fffffffffffff648,
             (Message *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),location,
             in_stack_fffffffffffff630);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
  }
  *(undefined8 *)(local_20 + 0x50) = 0;
  *(undefined8 *)(local_20 + 0x60) = 0;
  *(undefined8 *)(local_20 + 0x68) = 0;
  *(undefined8 *)(local_20 + 0x70) = 0;
  *(undefined8 *)(local_20 + 0x80) = 0;
  *(undefined8 *)(local_20 + 0x30) = 0;
  *(undefined8 *)(local_20 + 0x90) = 0;
  *(undefined8 *)(local_20 + 0x88) = 0;
  FVar3 = (FieldDescriptor)FieldDescriptorProto::has_default_value((FieldDescriptorProto *)0x4c1cf6)
  ;
  local_20[0x40] = FVar3;
  uVar4 = FieldDescriptorProto::has_default_value((FieldDescriptorProto *)0x4c1d21);
  if (((bool)uVar4) &&
     (in_stack_fffffffffffff7e5 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4c1d44),
     (bool)in_stack_fffffffffffff7e5)) {
    in_stack_fffffffffffff7d8 = FieldDescriptor::full_name_abi_cxx11_(local_20);
    AddError((DescriptorBuilder *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
             in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,
             (char *)in_stack_fffffffffffff5c0);
  }
  bVar2 = FieldDescriptorProto::has_type((FieldDescriptorProto *)0x4c1dab);
  if (bVar2) {
    bVar2 = FieldDescriptorProto::has_default_value((FieldDescriptorProto *)0x4c1dd1);
    if (bVar2) {
      local_f8 = (char *)0x0;
      CVar9 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4c1e03);
      switch(CVar9) {
      case CPPTYPE_INT32:
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c1e4d);
        pcVar13 = (char *)std::__cxx11::string::c_str();
        lVar11 = strtol(pcVar13,&local_f8,0);
        *(int *)(local_20 + 0x90) = (int)lVar11;
        break;
      case CPPTYPE_INT64:
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c1e98);
        std::__cxx11::string::c_str();
        iVar12 = strto64((char *)in_stack_fffffffffffff560,&in_stack_fffffffffffff558->text_,0);
        *(int64 *)(local_20 + 0x90) = iVar12;
        break;
      case CPPTYPE_UINT32:
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c1ef4);
        pcVar13 = (char *)std::__cxx11::string::c_str();
        uVar15 = strtoul(pcVar13,&local_f8,0);
        *(int *)(local_20 + 0x90) = (int)uVar15;
        break;
      case CPPTYPE_UINT64:
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c1f3f);
        std::__cxx11::string::c_str();
        uVar14 = strtou64((char *)in_stack_fffffffffffff560,&in_stack_fffffffffffff558->text_,0);
        *(uint64 *)(local_20 + 0x90) = uVar14;
        break;
      case CPPTYPE_DOUBLE:
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c2130);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff560,(char *)in_stack_fffffffffffff558);
        if (bVar2) {
          dVar18 = std::numeric_limits<double>::infinity();
          *(double *)(local_20 + 0x90) = dVar18;
        }
        else {
          FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c218b);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff560,(char *)in_stack_fffffffffffff558);
          if (bVar2) {
            dVar18 = std::numeric_limits<double>::infinity();
            *(double *)(local_20 + 0x90) = -dVar18;
          }
          else {
            FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c21fd);
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff560,(char *)in_stack_fffffffffffff558);
            if (bVar2) {
              dVar18 = std::numeric_limits<double>::quiet_NaN();
              *(double *)(local_20 + 0x90) = dVar18;
            }
            else {
              FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c2255);
              std::__cxx11::string::c_str();
              dVar18 = io::NoLocaleStrtod((char *)in_stack_fffffffffffff5a8,
                                          (char **)in_stack_fffffffffffff5a0);
              *(double *)(local_20 + 0x90) = dVar18;
            }
          }
        }
        break;
      case CPPTYPE_FLOAT:
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c1f9b);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff560,(char *)in_stack_fffffffffffff558);
        if (bVar2) {
          fVar17 = std::numeric_limits<float>::infinity();
          *(float *)(local_20 + 0x90) = fVar17;
        }
        else {
          FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c1ff6);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff560,(char *)in_stack_fffffffffffff558);
          if (bVar2) {
            fVar17 = std::numeric_limits<float>::infinity();
            *(float *)(local_20 + 0x90) = -fVar17;
          }
          else {
            FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c205e);
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff560,(char *)in_stack_fffffffffffff558);
            if (bVar2) {
              fVar17 = std::numeric_limits<float>::quiet_NaN();
              *(float *)(local_20 + 0x90) = fVar17;
            }
            else {
              FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c20b6);
              std::__cxx11::string::c_str();
              io::NoLocaleStrtod((char *)in_stack_fffffffffffff5a8,
                                 (char **)in_stack_fffffffffffff5a0);
              fVar17 = io::SafeDoubleToFloat((double)in_stack_fffffffffffff568);
              *(float *)(local_20 + 0x90) = fVar17;
            }
          }
        }
        break;
      case CPPTYPE_BOOL:
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c22b6);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff560,(char *)in_stack_fffffffffffff558);
        if (bVar2) {
          local_20[0x90] = (FieldDescriptor)0x1;
        }
        else {
          FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c230b);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff560,(char *)in_stack_fffffffffffff558);
          if (bVar2) {
            local_20[0x90] = (FieldDescriptor)0x0;
          }
          else {
            FieldDescriptor::full_name_abi_cxx11_(local_20);
            AddError((DescriptorBuilder *)
                     CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                     in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,
                     (char *)in_stack_fffffffffffff5c0);
          }
        }
        break;
      case CPPTYPE_ENUM:
        *(undefined8 *)(local_20 + 0x90) = 0;
        break;
      case CPPTYPE_STRING:
        TVar8 = FieldDescriptor::type(in_stack_fffffffffffff570);
        if (TVar8 == TYPE_BYTES) {
          FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c23fa);
          UnescapeCEscapeString((string *)in_stack_fffffffffffff5b8);
          psVar10 = DescriptorPool::Tables::AllocateString
                              (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
          *(string **)(local_20 + 0x90) = psVar10;
          std::__cxx11::string::~string(local_118);
        }
        else {
          FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c24aa);
          psVar10 = DescriptorPool::Tables::AllocateString
                              (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
          *(string **)(local_20 + 0x90) = psVar10;
        }
        break;
      case CPPTYPE_MESSAGE:
        FieldDescriptor::full_name_abi_cxx11_(local_20);
        AddError((DescriptorBuilder *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,
                 (char *)in_stack_fffffffffffff5c0);
        local_20[0x40] = (FieldDescriptor)0x0;
      }
      if (local_f8 != (char *)0x0) {
        FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c2556);
        uVar15 = std::__cxx11::string::empty();
        if (((uVar15 & 1) != 0) || (*local_f8 != '\0')) {
          FieldDescriptor::full_name_abi_cxx11_(local_20);
          FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)0x4c25b1);
          std::operator+((char *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
          std::operator+(in_stack_fffffffffffff568,(char *)in_stack_fffffffffffff560);
          AddError(in_stack_fffffffffffff650,in_stack_fffffffffffff648,
                   (Message *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),location
                   ,in_stack_fffffffffffff630);
          std::__cxx11::string::~string(local_138);
          std::__cxx11::string::~string(local_158);
        }
      }
    }
    else {
      CVar9 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4c269c);
      switch(CVar9) {
      case CPPTYPE_INT32:
        *(undefined4 *)(local_20 + 0x90) = 0;
        break;
      case CPPTYPE_INT64:
        *(undefined8 *)(local_20 + 0x90) = 0;
        break;
      case CPPTYPE_UINT32:
        *(undefined4 *)(local_20 + 0x90) = 0;
        break;
      case CPPTYPE_UINT64:
        *(undefined8 *)(local_20 + 0x90) = 0;
        break;
      case CPPTYPE_DOUBLE:
        *(undefined8 *)(local_20 + 0x90) = 0;
        break;
      case CPPTYPE_FLOAT:
        *(undefined4 *)(local_20 + 0x90) = 0;
        break;
      case CPPTYPE_BOOL:
        local_20[0x90] = (FieldDescriptor)0x0;
        break;
      case CPPTYPE_ENUM:
        *(undefined8 *)(local_20 + 0x90) = 0;
        break;
      case CPPTYPE_STRING:
        psVar10 = internal::GetEmptyString_abi_cxx11_();
        *(string **)(local_20 + 0x90) = psVar10;
        break;
      case CPPTYPE_MESSAGE:
      }
    }
  }
  iVar7 = FieldDescriptor::number(local_20);
  if (iVar7 < 1) {
    FieldDescriptor::full_name_abi_cxx11_(local_20);
    AddError((DescriptorBuilder *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
             in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,
             (char *)in_stack_fffffffffffff5c0);
  }
  else if (((local_21 & 1) == 0) && (iVar7 = FieldDescriptor::number(local_20), 0x1fffffff < iVar7))
  {
    in_stack_fffffffffffff650 = (DescriptorBuilder *)FieldDescriptor::full_name_abi_cxx11_(local_20)
    ;
    strings::internal::SubstituteArg::SubstituteArg
              (in_stack_fffffffffffff560,(int)((ulong)in_stack_fffffffffffff558 >> 0x20));
    strings::internal::SubstituteArg::SubstituteArg(local_1d8);
    strings::internal::SubstituteArg::SubstituteArg(&local_208);
    strings::internal::SubstituteArg::SubstituteArg(&local_238);
    strings::internal::SubstituteArg::SubstituteArg(&local_268);
    strings::internal::SubstituteArg::SubstituteArg(&local_298);
    strings::internal::SubstituteArg::SubstituteArg(&local_2c8);
    strings::internal::SubstituteArg::SubstituteArg(&local_2f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_328);
    strings::internal::SubstituteArg::SubstituteArg(&local_358);
    in_stack_fffffffffffff560 = &local_298;
    in_stack_fffffffffffff558 = &local_268;
    strings::Substitute_abi_cxx11_
              ((char *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
               (SubstituteArg *)CONCAT17(in_stack_fffffffffffff5b7,in_stack_fffffffffffff5b0),
               in_stack_fffffffffffff5a8,in_stack_fffffffffffff600,
               (SubstituteArg *)CONCAT17(in_stack_fffffffffffff60f,in_stack_fffffffffffff608),
               in_stack_fffffffffffff610,
               (SubstituteArg *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618),
               (SubstituteArg *)in_stack_fffffffffffff620,
               (SubstituteArg *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
    AddError(in_stack_fffffffffffff650,local_10,
             (Message *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),location,
             in_stack_fffffffffffff630);
    std::__cxx11::string::~string(local_178);
    in_stack_fffffffffffff648 = local_10;
  }
  else {
    in_stack_fffffffffffff644 = FieldDescriptor::number(local_20);
    if ((18999 < in_stack_fffffffffffff644) &&
       (in_stack_fffffffffffff640 = FieldDescriptor::number(local_20),
       in_stack_fffffffffffff640 < 20000)) {
      psVar10 = FieldDescriptor::full_name_abi_cxx11_(local_20);
      location = (ErrorLocation)((ulong)psVar10 >> 0x20);
      iVar7 = (int)((ulong)in_stack_fffffffffffff558 >> 0x20);
      strings::internal::SubstituteArg::SubstituteArg(in_stack_fffffffffffff560,iVar7);
      strings::internal::SubstituteArg::SubstituteArg(in_stack_fffffffffffff560,iVar7);
      strings::internal::SubstituteArg::SubstituteArg(local_408);
      strings::internal::SubstituteArg::SubstituteArg(&local_438);
      strings::internal::SubstituteArg::SubstituteArg(&local_468);
      strings::internal::SubstituteArg::SubstituteArg(&local_498);
      strings::internal::SubstituteArg::SubstituteArg(&local_4c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_4f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_528);
      strings::internal::SubstituteArg::SubstituteArg(&local_558);
      in_stack_fffffffffffff560 = &local_498;
      in_stack_fffffffffffff558 = &local_468;
      strings::Substitute_abi_cxx11_
                ((char *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                 in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                 (SubstituteArg *)CONCAT17(in_stack_fffffffffffff5b7,in_stack_fffffffffffff5b0),
                 in_stack_fffffffffffff5a8,in_stack_fffffffffffff600,
                 (SubstituteArg *)CONCAT17(in_stack_fffffffffffff60f,in_stack_fffffffffffff608),
                 in_stack_fffffffffffff610,
                 (SubstituteArg *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618),
                 (SubstituteArg *)in_stack_fffffffffffff620,
                 (SubstituteArg *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
      AddError(in_stack_fffffffffffff650,in_stack_fffffffffffff648,
               (Message *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),location,
               local_10);
      std::__cxx11::string::~string(local_378);
      in_stack_fffffffffffff630 = local_10;
    }
  }
  if ((local_21 & 1) == 0) {
    uVar5 = FieldDescriptorProto::has_extendee((FieldDescriptorProto *)0x4c2d05);
    if ((bool)uVar5) {
      in_stack_fffffffffffff600 = (SubstituteArg *)FieldDescriptor::full_name_abi_cxx11_(local_20);
      AddError((DescriptorBuilder *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,
               (char *)in_stack_fffffffffffff5c0);
    }
    *(Descriptor **)(local_20 + 0x50) = local_18;
    bVar2 = FieldDescriptorProto::has_oneof_index((FieldDescriptorProto *)0x4c2d80);
    if (bVar2) {
      iVar6 = FieldDescriptorProto::oneof_index((FieldDescriptorProto *)0x4c2da6);
      if (-1 < iVar6) {
        iVar6 = FieldDescriptorProto::oneof_index((FieldDescriptorProto *)0x4c2dc8);
        iVar7 = Descriptor::oneof_decl_count(local_18);
        if (iVar6 < iVar7) {
          iVar6 = FieldDescriptorProto::oneof_index((FieldDescriptorProto *)0x4c2ff3);
          pOVar16 = Descriptor::oneof_decl(local_18,iVar6);
          *(OneofDescriptor **)(local_20 + 0x58) = pOVar16;
          goto LAB_004c3033;
        }
      }
      FieldDescriptor::full_name_abi_cxx11_(local_20);
      FieldDescriptorProto::oneof_index((FieldDescriptorProto *)0x4c2e29);
      strings::internal::SubstituteArg::SubstituteArg
                (in_stack_fffffffffffff560,(int)((ulong)in_stack_fffffffffffff558 >> 0x20));
      Descriptor::name_abi_cxx11_(local_18);
      strings::internal::SubstituteArg::SubstituteArg
                (in_stack_fffffffffffff560,(string *)in_stack_fffffffffffff558);
      strings::internal::SubstituteArg::SubstituteArg(local_608);
      strings::internal::SubstituteArg::SubstituteArg(&local_638);
      strings::internal::SubstituteArg::SubstituteArg(&local_668);
      strings::internal::SubstituteArg::SubstituteArg(&local_698);
      strings::internal::SubstituteArg::SubstituteArg(&local_6c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_6f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_728);
      strings::internal::SubstituteArg::SubstituteArg(&local_758);
      strings::Substitute_abi_cxx11_
                ((char *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                 in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                 (SubstituteArg *)CONCAT17(in_stack_fffffffffffff5b7,in_stack_fffffffffffff5b0),
                 in_stack_fffffffffffff5a8,in_stack_fffffffffffff600,
                 (SubstituteArg *)CONCAT17(uVar5,in_stack_fffffffffffff608),
                 in_stack_fffffffffffff610,
                 (SubstituteArg *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618),
                 (SubstituteArg *)in_stack_fffffffffffff620,
                 (SubstituteArg *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
      AddError(in_stack_fffffffffffff650,in_stack_fffffffffffff648,
               (Message *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),location,
               in_stack_fffffffffffff630);
      std::__cxx11::string::~string(local_578);
      *(undefined8 *)(local_20 + 0x58) = 0;
    }
    else {
      *(undefined8 *)(local_20 + 0x58) = 0;
    }
  }
  else {
    bVar2 = FieldDescriptorProto::has_extendee((FieldDescriptorProto *)0x4c2c0e);
    if (!bVar2) {
      FieldDescriptor::full_name_abi_cxx11_(local_20);
      AddError((DescriptorBuilder *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,
               (char *)in_stack_fffffffffffff5c0);
    }
    *(Descriptor **)(local_20 + 0x60) = local_18;
    bVar2 = FieldDescriptorProto::has_oneof_index((FieldDescriptorProto *)0x4c2c89);
    if (bVar2) {
      FieldDescriptor::full_name_abi_cxx11_(local_20);
      AddError((DescriptorBuilder *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,
               (char *)in_stack_fffffffffffff5c0);
    }
    *(undefined8 *)(local_20 + 0x58) = 0;
  }
LAB_004c3033:
  uVar5 = FieldDescriptorProto::has_options((FieldDescriptorProto *)0x4c3040);
  if ((bool)uVar5) {
    orig_options = FieldDescriptorProto::options((FieldDescriptorProto *)0x4c306f);
    AllocateOptions<google::protobuf::FieldDescriptor>
              ((DescriptorBuilder *)CONCAT17(uVar5,in_stack_fffffffffffff5b0),orig_options,
               (FieldDescriptor *)in_stack_fffffffffffff5a0,options_field_tag);
  }
  else {
    *(undefined8 *)(local_20 + 0x78) = 0;
  }
  FieldDescriptor::full_name_abi_cxx11_(local_20);
  FieldDescriptor::name_abi_cxx11_(local_20);
  Symbol::Symbol(&local_768,local_20);
  symbol.field_1.descriptor = in_stack_fffffffffffff818.descriptor;
  symbol._0_8_ = in_stack_fffffffffffff810;
  AddSymbol(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
            (string *)
            CONCAT17(FVar3,CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffff7e5,
                                                   in_stack_fffffffffffff7e0))),
            (Message *)in_stack_fffffffffffff7d8,symbol);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              const Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension) {
  const std::string& scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  std::string* full_name = AllocateNameString(scope, proto.name());
  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_ = tables_->AllocateString(proto.name());
  result->full_name_ = full_name;
  result->file_ = file_;
  result->number_ = proto.number();
  result->is_extension_ = is_extension;

  // If .proto files follow the style guide then the name should already be
  // lower-cased.  If that's the case we can just reuse the string we
  // already allocated rather than allocate a new one.
  std::string lowercase_name(proto.name());
  LowerString(&lowercase_name);
  if (lowercase_name == proto.name()) {
    result->lowercase_name_ = result->name_;
  } else {
    result->lowercase_name_ = tables_->AllocateString(lowercase_name);
  }

  // Don't bother with the above optimization for camel-case names since
  // .proto files that follow the guide shouldn't be using names in this
  // format, so the optimization wouldn't help much.
  result->camelcase_name_ =
      tables_->AllocateString(ToCamelCase(proto.name(),
                                          /* lower_first = */ true));

  if (proto.has_json_name()) {
    result->has_json_name_ = true;
    result->json_name_ = tables_->AllocateString(proto.json_name());
  } else {
    result->has_json_name_ = false;
    result->json_name_ = tables_->AllocateString(ToJsonName(proto.name()));
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  result->type_ = static_cast<FieldDescriptor::Type>(
      implicit_cast<int>(proto.type()));
  result->label_ = static_cast<FieldDescriptor::Label>(
      implicit_cast<int>(proto.label()));

  // An extension cannot have a required field (b/13365836).
  if (result->is_extension_ &&
      result->label_ == FieldDescriptor::LABEL_REQUIRED) {
    AddError(result->full_name(), proto,
             // Error location `TYPE`: we would really like to indicate
             // `LABEL`, but the `ErrorLocation` enum has no entry for this, and
             // we don't necessarily know about all implementations of the
             // `ErrorCollector` interface to extend them to handle the new
             // error location type properly.
             DescriptorPool::ErrorCollector::TYPE,
             "The extension " + result->full_name() + " cannot be required.");
  }

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = nullptr;
  result->extension_scope_ = nullptr;
  result->message_type_ = nullptr;
  result->enum_type_ = nullptr;
  result->type_name_ = nullptr;
  result->type_once_ = nullptr;
  result->default_value_enum_ = nullptr;
  result->default_value_enum_name_ = nullptr;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = nullptr;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ =
              strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ =
              strto64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ =
              strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ =
              strtou64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ =
                std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ =
                -std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ =
                std::numeric_limits<float>::quiet_NaN();
          } else {
            result->default_value_float_ = io::SafeDoubleToFloat(
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos));
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ =
                std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ =
                -std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ =
                std::numeric_limits<double>::quiet_NaN();
          } else {
            result->default_value_double_ =
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            result->default_value_string_ = tables_->AllocateString(
                UnescapeCEscapeString(proto.default_value()));
          } else {
            result->default_value_string_ =
                tables_->AllocateString(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          break;
      }

      if (end_pos != nullptr) {
        // end_pos is only set non-null by the parsers for numeric types,
        // above. This checks that the default was non-empty and had no extra
        // junk after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Couldn't parse default value \"" + proto.default_value() +
                       "\".");
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &internal::GetEmptyString();
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          break;
      }
    }
  }

  if (result->number() <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute("Field numbers cannot be greater than $0.",
                                 FieldDescriptor::kMaxNumber));
  } else if (result->number() >= FieldDescriptor::kFirstReservedNumber &&
             result->number() <= FieldDescriptor::kLastReservedNumber) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute(
                 "Field numbers $0 through $1 are reserved for the protocol "
                 "buffer library implementation.",
                 FieldDescriptor::kFirstReservedNumber,
                 FieldDescriptor::kLastReservedNumber));
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->extension_scope_ = parent;

    if (proto.has_oneof_index()) {
      AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "FieldDescriptorProto.oneof_index should not be set for "
               "extensions.");
    }

    // Fill in later (maybe).
    result->containing_oneof_ = nullptr;
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;

    if (proto.has_oneof_index()) {
      if (proto.oneof_index() < 0 ||
          proto.oneof_index() >= parent->oneof_decl_count()) {
        AddError(result->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 strings::Substitute("FieldDescriptorProto.oneof_index $0 is "
                                     "out of range for type \"$1\".",
                                     proto.oneof_index(), parent->name()));
        result->containing_oneof_ = nullptr;
      } else {
        result->containing_oneof_ = parent->oneof_decl(proto.oneof_index());
      }
    } else {
      result->containing_oneof_ = nullptr;
    }
  }

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result,
                    FieldDescriptorProto::kOptionsFieldNumber);
  }


  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));
}